

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragScalar(char *label,ImGuiDataType data_type,void *p_data,float v_speed,void *p_min,
                      void *p_max,char *format,float power)

{
  bool bVar1;
  ImGuiSliderFlags flags;
  
  if ((power != 1.0) || (NAN(power))) {
    if ((power != 1.0) || (NAN(power))) {
      __assert_fail("power == 1.0f && \"Call function with ImGuiSliderFlags_Logarithmic flags instead of using the old \'float power\' function!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                    ,0x9f3,
                    "bool ImGui::DragScalar(const char *, ImGuiDataType, void *, float, const void *, const void *, const char *, float)"
                   );
    }
    if ((p_min == (void *)0x0) || (flags = 0x20, p_max == (void *)0x0)) {
      __assert_fail("p_min != __null && p_max != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                    ,0x9f4,
                    "bool ImGui::DragScalar(const char *, ImGuiDataType, void *, float, const void *, const void *, const char *, float)"
                   );
    }
  }
  else {
    flags = 0;
  }
  bVar1 = DragScalar(label,data_type,p_data,v_speed,p_min,p_max,format,flags);
  return bVar1;
}

Assistant:

bool ImGui::DragScalar(const char* label, ImGuiDataType data_type, void* p_data, float v_speed, const void* p_min, const void* p_max, const char* format, float power)
{
    ImGuiSliderFlags drag_flags = ImGuiSliderFlags_None;
    if (power != 1.0f)
    {
        IM_ASSERT(power == 1.0f && "Call function with ImGuiSliderFlags_Logarithmic flags instead of using the old 'float power' function!");
        IM_ASSERT(p_min != NULL && p_max != NULL);  // When using a power curve the drag needs to have known bounds
        drag_flags |= ImGuiSliderFlags_Logarithmic;   // Fallback for non-asserting paths
    }
    return DragScalar(label, data_type, p_data, v_speed, p_min, p_max, format, drag_flags);
}